

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

int __thiscall geemuboi::core::CPU::sbc_a_b(CPU *this)

{
  uint8_t *puVar1;
  byte bVar2;
  Registers *pRVar3;
  int iVar4;
  uint8_t uVar5;
  uint uVar6;
  
  pRVar3 = this->regs;
  uVar6 = pRVar3->f >> 4 & 1;
  pRVar3->f = '@';
  bVar2 = pRVar3->a;
  if ((int)(bVar2 & 0xf) < (int)((pRVar3->b & 0xf) - uVar6)) {
    pRVar3->f = '`';
  }
  iVar4 = pRVar3->b - uVar6;
  if ((int)(uint)bVar2 < iVar4) {
    pRVar3->f = pRVar3->f | 0x10;
  }
  uVar5 = bVar2 - (char)iVar4;
  pRVar3->a = uVar5;
  if (uVar5 == '\0') {
    puVar1 = &this->regs->f;
    *puVar1 = *puVar1 | 0x80;
  }
  return 1;
}

Assistant:

int CPU::sbc_a_b() {
    sbc_r8_r8(regs.a, regs.b);
    return 1;
}